

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

int CVmObjGramProd::tok_equals_lit
              (vmgramprod_tok *tok,char *lit,size_t lit_len,CVmObjDict *dict,vm_val_t *result_val)

{
  uint uVar1;
  int iVar2;
  
  if (dict == (CVmObjDict *)0x0) {
    uVar1 = 0;
    if (tok->len_ == lit_len) {
      iVar2 = bcmp(tok->txt_,lit,lit_len);
      uVar1 = (uint)(iVar2 == 0);
    }
    result_val->typ = VM_INT;
    (result_val->val).intval = uVar1;
  }
  else {
    uVar1 = CVmObjDict::match_strings(dict,&tok->val_,tok->txt_,tok->len_,lit,lit_len,result_val);
  }
  return uVar1;
}

Assistant:

int CVmObjGramProd::tok_equals_lit(VMG_ const struct vmgramprod_tok *tok,
                                   const char *lit, size_t lit_len,
                                   CVmObjDict *dict, vm_val_t *result_val)
{
    /* 
     *   if there's a dictionary, ask it to do the comparison; otherwise,
     *   use an exact literal match 
     */
    if (dict != 0)
    {
        /* ask the dictionary for the comparison */
        return dict->match_strings(vmg_ &tok->val_, tok->txt_, tok->len_,
                                   lit, lit_len, result_val);
    }
    else
    {
        /* perform an exact comparison */
        result_val->set_int(tok->len_ == lit_len
                            && memcmp(tok->txt_, lit, lit_len) == 0);
        return result_val->val.intval;
    }
}